

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netrc.c
# Opt level: O2

int parsenetrc(store_netrc *store,char *host,char **loginp,char **passwordp,char *netrcfile)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  long lVar4;
  uint uVar5;
  bool bVar6;
  int iVar7;
  CURLcode CVar8;
  FILE *__stream;
  char *pcVar9;
  uint uVar10;
  size_t len;
  char *__s;
  bool bVar11;
  int local_d8;
  char *local_90;
  dynbuf linebuf;
  dynbuf token;
  
  pcVar2 = *loginp;
  pcVar3 = *passwordp;
  Curl_dyn_init(&token,0x80);
  if ((store->field_0x28 & 1) == 0) {
    __stream = fopen64(netrcfile,"r");
    Curl_dyn_init(&linebuf,0x1000);
    if (__stream == (FILE *)0x0) {
LAB_00144099:
      bVar11 = true;
    }
    else {
      do {
        iVar7 = Curl_get_line(&linebuf,(FILE *)__stream);
        bVar11 = iVar7 == 0;
        if (bVar11) goto LAB_00144099;
        for (pcVar9 = Curl_dyn_ptr(&linebuf); (cVar1 = *pcVar9, cVar1 == '\t' || (cVar1 == ' '));
            pcVar9 = pcVar9 + 1) {
        }
      } while ((cVar1 == '#') || (CVar8 = Curl_dyn_add(&store->filebuf,pcVar9), CVar8 == CURLE_OK));
    }
    Curl_dyn_free(&linebuf);
    if (__stream != (FILE *)0x0) {
      fclose(__stream);
    }
    if (!bVar11) {
      return -1;
    }
    store->field_0x28 = store->field_0x28 | 1;
  }
  local_90 = Curl_dyn_ptr(&store->filebuf);
  uVar10 = 0;
  bVar11 = false;
  local_d8 = 1;
LAB_00144116:
  do {
    if ((bVar11) || (local_90 == (char *)0x0)) goto LAB_001444f5;
    Curl_dyn_reset(&token);
    pcVar9 = local_90 + 2;
    for (__s = local_90; (cVar1 = *__s, cVar1 == ' ' || (cVar1 == '\t')); __s = __s + 1) {
      pcVar9 = pcVar9 + 1;
    }
    uVar5 = (uint)(cVar1 != '\r') * 3;
    if (cVar1 == '\n') {
      uVar5 = 0;
    }
    if (uVar10 != 3) {
      uVar5 = uVar10;
    }
    uVar10 = uVar5;
    if (cVar1 == '\"') {
      bVar11 = false;
      do {
        cVar1 = pcVar9[-1];
        if (cVar1 == '\0') {
LAB_001444ea:
          local_d8 = -1;
          goto LAB_001444f5;
        }
        linebuf.bufr._0_1_ = cVar1;
        if (bVar11) {
          if (cVar1 == 't') {
            linebuf.bufr._0_1_ = '\t';
          }
          else if (cVar1 == 'r') {
            linebuf.bufr._0_1_ = '\r';
          }
          else if (cVar1 == 'n') {
            linebuf.bufr._0_1_ = '\n';
          }
          bVar11 = false;
LAB_00144289:
          CVar8 = Curl_dyn_addn(&token,&linebuf,1);
          bVar6 = bVar11;
          if (CVar8 != CURLE_OK) goto LAB_001444ea;
        }
        else {
          bVar6 = true;
          if (cVar1 != '\\') {
            if (cVar1 != '\"') goto LAB_00144289;
            goto LAB_001441d9;
          }
        }
        bVar11 = bVar6;
        pcVar9 = pcVar9 + 1;
      } while( true );
    }
    if ((cVar1 == '\0') || (cVar1 == '\n')) break;
    len = 0;
    while (((cVar1 != '\t' && (cVar1 != ' ')) && ((byte)(cVar1 - 0xeU) < 0xfc))) {
      lVar4 = len + 1;
      len = len + 1;
      cVar1 = __s[lVar4];
    }
    if ((len == 0) || (CVar8 = Curl_dyn_addn(&token,__s,len), CVar8 != CURLE_OK)) {
      local_d8 = -1;
      goto LAB_001444f5;
    }
LAB_001441d9:
    if (((pcVar2 == (char *)0x0) || (*pcVar2 == '\0')) ||
       ((pcVar3 == (char *)0x0 || (*pcVar3 == '\0')))) {
      Curl_dyn_ptr(&token);
      iVar7 = (*(code *)(&DAT_00172c18 + *(int *)(&DAT_00172c18 + (ulong)uVar10 * 4)))();
      return iVar7;
    }
    bVar11 = true;
  } while( true );
  pcVar9 = strchr(__s,10);
  local_90 = pcVar9 + 1;
  if (pcVar9 == (char *)0x0) {
LAB_001444f5:
    Curl_dyn_free(&token);
    if (local_d8 == 0) {
      local_d8 = 0;
    }
    else {
      Curl_dyn_free(&store->filebuf);
    }
    return local_d8;
  }
  goto LAB_00144116;
}

Assistant:

static int parsenetrc(struct store_netrc *store,
                      const char *host,
                      char **loginp,
                      char **passwordp,
                      const char *netrcfile)
{
  int retcode = NETRC_FILE_MISSING;
  char *login = *loginp;
  char *password = *passwordp;
  bool specific_login = (login && *login != 0);
  bool login_alloc = FALSE;
  bool password_alloc = FALSE;
  enum host_lookup_state state = NOTHING;
  enum found_state found = NONE;
  bool our_login = TRUE;  /* With specific_login, found *our* login name (or
                             login-less line) */
  bool done = FALSE;
  char *netrcbuffer;
  struct dynbuf token;
  struct dynbuf *filebuf = &store->filebuf;
  Curl_dyn_init(&token, MAX_NETRC_TOKEN);

  if(!store->loaded) {
    if(file2memory(netrcfile, filebuf))
      return NETRC_FAILED;
    store->loaded = TRUE;
  }

  netrcbuffer = Curl_dyn_ptr(filebuf);

  while(!done) {
    char *tok = netrcbuffer;
    while(tok) {
      char *tok_end;
      bool quoted;
      Curl_dyn_reset(&token);
      while(ISBLANK(*tok))
        tok++;
      /* tok is first non-space letter */
      if(state == MACDEF) {
        if((*tok == '\n') || (*tok == '\r'))
          state = NOTHING; /* end of macro definition */
      }

      if(!*tok || (*tok == '\n'))
        /* end of line  */
        break;

      /* leading double-quote means quoted string */
      quoted = (*tok == '\"');

      tok_end = tok;
      if(!quoted) {
        size_t len = 0;
        while(!ISSPACE(*tok_end)) {
          tok_end++;
          len++;
        }
        if(!len || Curl_dyn_addn(&token, tok, len)) {
          retcode = NETRC_FAILED;
          goto out;
        }
      }
      else {
        bool escape = FALSE;
        bool endquote = FALSE;
        tok_end++; /* pass the leading quote */
        while(*tok_end) {
          char s = *tok_end;
          if(escape) {
            escape = FALSE;
            switch(s) {
            case 'n':
              s = '\n';
              break;
            case 'r':
              s = '\r';
              break;
            case 't':
              s = '\t';
              break;
            }
          }
          else if(s == '\\') {
            escape = TRUE;
            tok_end++;
            continue;
          }
          else if(s == '\"') {
            tok_end++; /* pass the ending quote */
            endquote = TRUE;
            break;
          }
          if(Curl_dyn_addn(&token, &s, 1)) {
            retcode = NETRC_FAILED;
            goto out;
          }
          tok_end++;
        }
        if(escape || !endquote) {
          /* bad syntax, get out */
          retcode = NETRC_FAILED;
          goto out;
        }
      }

      if((login && *login) && (password && *password)) {
        done = TRUE;
        break;
      }

      tok = Curl_dyn_ptr(&token);

      switch(state) {
      case NOTHING:
        if(strcasecompare("macdef", tok))
          /* Define a macro. A macro is defined with the specified name; its
             contents begin with the next .netrc line and continue until a
             null line (consecutive new-line characters) is encountered. */
          state = MACDEF;
        else if(strcasecompare("machine", tok))
          /* the next tok is the machine name, this is in itself the delimiter
             that starts the stuff entered for this machine, after this we
             need to search for 'login' and 'password'. */
          state = HOSTFOUND;
        else if(strcasecompare("default", tok)) {
          state = HOSTVALID;
          retcode = NETRC_SUCCESS; /* we did find our host */
        }
        break;
      case MACDEF:
        if(!*tok)
          state = NOTHING;
        break;
      case HOSTFOUND:
        if(strcasecompare(host, tok)) {
          /* and yes, this is our host! */
          state = HOSTVALID;
          retcode = NETRC_SUCCESS; /* we did find our host */
        }
        else
          /* not our host */
          state = NOTHING;
        break;
      case HOSTVALID:
        /* we are now parsing sub-keywords concerning "our" host */
        if(found == LOGIN) {
          if(specific_login) {
            our_login = !Curl_timestrcmp(login, tok);
          }
          else if(!login || Curl_timestrcmp(login, tok)) {
            if(login_alloc)
              free(login);
            login = strdup(tok);
            if(!login) {
              retcode = NETRC_FAILED; /* allocation failed */
              goto out;
            }
            login_alloc = TRUE;
          }
          found = NONE;
        }
        else if(found == PASSWORD) {
          if((our_login || !specific_login) &&
             (!password || Curl_timestrcmp(password, tok))) {
            if(password_alloc)
              free(password);
            password = strdup(tok);
            if(!password) {
              retcode = NETRC_FAILED; /* allocation failed */
              goto out;
            }
            password_alloc = TRUE;
          }
          found = NONE;
        }
        else if(strcasecompare("login", tok))
          found = LOGIN;
        else if(strcasecompare("password", tok))
          found = PASSWORD;
        else if(strcasecompare("machine", tok)) {
          /* ok, there is machine here go => */
          state = HOSTFOUND;
          found = NONE;
        }
        break;
      } /* switch (state) */
      tok = ++tok_end;
    }
    if(!done) {
      char *nl = NULL;
      if(tok)
        nl = strchr(tok, '\n');
      if(!nl)
        break;
      /* point to next line */
      netrcbuffer = &nl[1];
    }
  } /* while !done */

out:
  Curl_dyn_free(&token);
  if(!retcode) {
    /* success */
    if(login_alloc) {
      free(*loginp);
      *loginp = login;
    }
    if(password_alloc) {
      free(*passwordp);
      *passwordp = password;
    }
  }
  else {
    Curl_dyn_free(filebuf);
    if(login_alloc)
      free(login);
    if(password_alloc)
      free(password);
  }

  return retcode;
}